

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

bool CountHighbitsCollisions<Blob<256>>
               (vector<Blob<256>,_std::allocator<Blob<256>_>_> *hashes,int nbHBits)

{
  pointer pBVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Blob<256> h2;
  Blob<256> h1;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  bVar3 = true;
  if (nbHBits < 0x100) {
    uVar7 = (long)(hashes->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(hashes->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 5;
    auVar11._0_8_ = (double)(int)uVar7;
    dVar9 = ldexp(1.0,nbHBits);
    auVar10._0_8_ = (auVar11._0_8_ * (double)((int)uVar7 + -1)) / dVar9;
    auVar10._8_8_ = 0;
    auVar11._8_8_ = 0;
    auVar10 = vminsd_avx(auVar11,auVar10);
    printf("Testing collisions (high %2i-bit) - Expected %12.1f, ",(ulong)(uint)nbHBits);
    uVar8 = 0;
    if (1 < uVar7) {
      uVar8 = 0;
      uVar6 = 1;
      do {
        pBVar1 = (hashes->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
                 super__Vector_impl_data._M_start + (uVar6 - 1);
        local_58 = *(undefined8 *)pBVar1->bytes;
        uStack_50 = *(undefined8 *)(pBVar1->bytes + 8);
        uStack_48 = *(undefined8 *)(pBVar1->bytes + 0x10);
        uStack_40 = *(undefined8 *)(pBVar1->bytes + 0x18);
        rshift32(&local_58,0x20,0x100 - nbHBits);
        pBVar1 = (hashes->super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar6;
        local_78 = *(undefined8 *)pBVar1->bytes;
        uStack_70 = *(undefined8 *)(pBVar1->bytes + 8);
        uStack_68 = *(undefined8 *)(pBVar1->bytes + 0x10);
        uStack_60 = *(undefined8 *)(pBVar1->bytes + 0x18);
        rshift32(&local_78,0x20,0x100 - nbHBits);
        uVar4 = 0;
        if ((char)local_58 == (char)local_78) {
          uVar2 = 0;
          do {
            uVar5 = uVar2;
            if (uVar5 == 0x1f) break;
            uVar2 = uVar5 + 1;
          } while (*(char *)((long)&local_58 + uVar5 + 1) == *(char *)((long)&local_78 + uVar5 + 1))
          ;
          uVar4 = (uint)(0x1e < uVar5);
        }
        uVar8 = uVar8 + uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar7);
    }
    dVar9 = (double)(int)uVar8 / auVar10._0_8_;
    printf("actual %6i (%.2fx)",(ulong)uVar8);
    if ((0.98 < dVar9) && (uVar8 = uVar8 - (int)auVar10._0_8_, uVar8 != 0)) {
      printf(" (%i)",(ulong)uVar8);
    }
    if (2.0 < dVar9) {
      puts(" !!!!!");
    }
    else {
      putchar(10);
    }
    bVar3 = 2.0 >= dVar9;
  }
  return bVar3;
}

Assistant:

bool CountHighbitsCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbHBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = hashes.size();
  double expected = EstimateNbCollisions(nbH, nbHBits);
  printf("Testing collisions (high %2i-bit) - Expected %12.1f, ", nbHBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
    {
      collcount++;
    }
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}